

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::SerializeWithCachedSizes
          (VisionFeaturePrint_Objects *this,CodedOutputStream *output)

{
  int iVar1;
  char *data;
  Type *pTVar2;
  int index;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  
  if (this->version_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->version_,output);
  }
  iVar1 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar1) {
    this_00 = &this->output_;
    index = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      data = (pTVar2->_M_dataplus)._M_p;
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar2->_M_string_length,SERIALIZE,
                 "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output");
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::WriteString(100,pTVar2,output);
      index = index + 1;
    } while (iVar1 != index);
  }
  return;
}

Assistant:

void VisionFeaturePrint_Objects::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.ObjectsVersion version = 1;
  if (this->version() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->version(), output);
  }

  // repeated string output = 100;
  for (int i = 0, n = this->output_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->output(i).data(), this->output(i).length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      100, this->output(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
}